

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_canbus.cc
# Opt level: O0

int __thiscall ccel::canbus::canbus_handler::open(canbus_handler *this,char *__file,int __oflag,...)

{
  native_handle_type nVar1;
  unspecified_bool_type p_Var2;
  logic_error *this_00;
  int iStack000000000000001c;
  undefined8 in_stack_00000018;
  char *in_stack_00000020;
  runtime_error *_e;
  error_code __tmp_ec_holder;
  native_handle_type __tmp_sock_holder;
  undefined4 in_stack_ffffffffffffffa0;
  descriptor *in_stack_ffffffffffffffa8;
  error_code local_40 [2];
  native_handle_type local_1c;
  char *local_18;
  canbus_handler *local_10;
  
  iStack000000000000001c = (int)((ulong)in_stack_00000018 >> 0x20);
  local_18 = __file;
  local_10 = this;
  nVar1 = open_cansock(in_stack_00000020,iStack000000000000001c);
  local_1c = nVar1;
  boost::system::error_code::error_code(local_40);
  boost::asio::posix::descriptor::assign
            (in_stack_ffffffffffffffa8,
             (native_handle_type *)CONCAT44(nVar1,in_stack_ffffffffffffffa0),(error_code *)this);
  p_Var2 = boost::system::error_code::operator_cast_to_function_pointer(local_40);
  if (p_Var2 != (unspecified_bool_type)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"[CANBUS_Handler]boost_basic_stream assign error happend.");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  (this->super_base_handler)._open = true;
  std::__cxx11::string::operator=((string *)&this->_interface_name,local_18);
  return 0;
}

Assistant:

int canbus_handler::open(const char *interface_name) {
  try {
    auto __tmp_sock_holder = open_cansock(interface_name);
    boost::system::error_code __tmp_ec_holder;
    _stream.assign(__tmp_sock_holder, __tmp_ec_holder);
    if (__tmp_ec_holder)
      throw std::logic_error(
          "[CANBUS_Handler]boost_basic_stream assign error happend.");
    _open = true;
    _interface_name = interface_name;
    return 0;
  } catch (std::runtime_error &_e) {
    return -1;
  } catch (...) {
    throw;
  }
}